

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * __thiscall
despot::util::tinyxml::TiXmlAttribute::Parse
          (TiXmlAttribute *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  bool bVar1;
  char *pcVar2;
  TiXmlCursor *pTVar3;
  char *p_00;
  bool bVar4;
  char DOUBLE_QUOTE;
  char SINGLE_QUOTE;
  char *end;
  char *pErr;
  TiXmlEncoding encoding_local;
  TiXmlParsingData *data_local;
  char *p_local;
  TiXmlAttribute *this_local;
  
  pcVar2 = TiXmlBase::SkipWhiteSpace(p,encoding);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    this_local = (TiXmlAttribute *)0x0;
  }
  else {
    if (data != (TiXmlParsingData *)0x0) {
      TiXmlParsingData::Stamp(data,pcVar2,encoding);
      pTVar3 = TiXmlParsingData::Cursor(data);
      (this->super_TiXmlBase).location = *pTVar3;
    }
    p_00 = TiXmlBase::ReadName(pcVar2,&this->name,encoding);
    if ((p_00 == (char *)0x0) || (*p_00 == '\0')) {
      if (this->document != (TiXmlDocument *)0x0) {
        TiXmlDocument::SetError(this->document,7,pcVar2,data,encoding);
      }
      this_local = (TiXmlAttribute *)0x0;
    }
    else {
      pcVar2 = TiXmlBase::SkipWhiteSpace(p_00,encoding);
      if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) || (*pcVar2 != '=')) {
        if (this->document != (TiXmlDocument *)0x0) {
          TiXmlDocument::SetError(this->document,7,pcVar2,data,encoding);
        }
        this_local = (TiXmlAttribute *)0x0;
      }
      else {
        data_local = (TiXmlParsingData *)TiXmlBase::SkipWhiteSpace(pcVar2 + 1,encoding);
        if ((data_local == (TiXmlParsingData *)0x0) || ((char)(data_local->cursor).row == '\0')) {
          if (this->document != (TiXmlDocument *)0x0) {
            TiXmlDocument::SetError(this->document,7,(char *)data_local,data,encoding);
          }
          this_local = (TiXmlAttribute *)0x0;
        }
        else {
          if ((char)(data_local->cursor).row == '\'') {
            data_local = (TiXmlParsingData *)
                         TiXmlBase::ReadText((char *)((long)&(data_local->cursor).row + 1),
                                             &this->value,false,"\'",false,encoding);
          }
          else if ((char)(data_local->cursor).row == '\"') {
            data_local = (TiXmlParsingData *)
                         TiXmlBase::ReadText((char *)((long)&(data_local->cursor).row + 1),
                                             &this->value,false,"\"",false,encoding);
          }
          else {
            TiXmlString::operator=(&this->value,"");
            while( true ) {
              bVar4 = false;
              if ((data_local != (TiXmlParsingData *)0x0) &&
                 (bVar4 = false, (char)(data_local->cursor).row != '\0')) {
                bVar1 = TiXmlBase::IsWhiteSpace((char)(data_local->cursor).row);
                bVar4 = false;
                if ((!bVar1) &&
                   (((bVar4 = false, (char)(data_local->cursor).row != '\n' &&
                     (bVar4 = false, (char)(data_local->cursor).row != '\r')) &&
                    (bVar4 = false, (char)(data_local->cursor).row != '/')))) {
                  bVar4 = (char)(data_local->cursor).row != '>';
                }
              }
              if (!bVar4) break;
              if (((char)(data_local->cursor).row == '\'') ||
                 ((char)(data_local->cursor).row == '\"')) {
                if (this->document != (TiXmlDocument *)0x0) {
                  TiXmlDocument::SetError(this->document,7,(char *)data_local,data,encoding);
                }
                return (char *)0x0;
              }
              TiXmlString::operator+=(&this->value,(char)(data_local->cursor).row);
              data_local = (TiXmlParsingData *)((long)&(data_local->cursor).row + 1);
            }
          }
          this_local = (TiXmlAttribute *)data_local;
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* TiXmlAttribute::Parse(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	p = SkipWhiteSpace(p, encoding);
	if (!p || !*p)
		return 0;

	//	int tabsize = 4;
	//	if ( document )
	//		tabsize = document->TabSize();

	if (data) {
		data->Stamp(p, encoding);
		location = data->Cursor();
	}
	// Read the name, the '=' and the value.
	const char* pErr = p;
	p = ReadName(p, &name, encoding);
	if (!p || !*p) {
		if (document)
			document->SetError(TIXML_ERROR_READING_ATTRIBUTES, pErr, data,
				encoding);
		return 0;
	}
	p = SkipWhiteSpace(p, encoding);
	if (!p || !*p || *p != '=') {
		if (document)
			document->SetError(TIXML_ERROR_READING_ATTRIBUTES, p, data,
				encoding);
		return 0;
	}

	++p; // skip '='
	p = SkipWhiteSpace(p, encoding);
	if (!p || !*p) {
		if (document)
			document->SetError(TIXML_ERROR_READING_ATTRIBUTES, p, data,
				encoding);
		return 0;
	}

	const char* end;
	const char SINGLE_QUOTE = '\'';
	const char DOUBLE_QUOTE = '\"';

	if (*p == SINGLE_QUOTE) {
		++p;
		end = "\'"; // single quote in string
		p = ReadText(p, &value, false, end, false, encoding);
	} else if (*p == DOUBLE_QUOTE) {
		++p;
		end = "\""; // double quote in string
		p = ReadText(p, &value, false, end, false, encoding);
	} else {
		// All attribute values should be in single or double quotes.
		// But this is such a common error that the parser will try
		// its best, even without them.
		value = "";
		while (p && *p // existence
			&& !IsWhiteSpace(*p) && *p != '\n' && *p != '\r' // whitespace
			&& *p != '/' && *p != '>') // tag end
		{
			if (*p == SINGLE_QUOTE || *p == DOUBLE_QUOTE) {
				// [ 1451649 ] Attribute values with trailing quotes not handled correctly
				// We did not have an opening quote but seem to have a
				// closing one. Give up and throw an error.
				if (document)
					document->SetError(TIXML_ERROR_READING_ATTRIBUTES, p, data,
						encoding);
				return 0;
			}
			value += *p;
			++p;
		}
	}
	return p;
}